

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# having_binder.cpp
# Opt level: O2

void __thiscall
duckdb::HavingBinder::HavingBinder
          (HavingBinder *this,Binder *binder,ClientContext *context,BoundSelectNode *node,
          BoundGroupInformation *info,AggregateHandling aggregate_handling)

{
  LogicalType local_30;
  
  BaseSelectBinder::BaseSelectBinder(&this->super_BaseSelectBinder,binder,context,node,info);
  (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder =
       (_func_int **)&PTR__HavingBinder_027a45a0;
  ColumnAliasBinder::ColumnAliasBinder(&this->column_alias_binder,&node->bind_state);
  this->aggregate_handling = aggregate_handling;
  LogicalType::LogicalType(&local_30,BOOLEAN);
  LogicalType::operator=
            (&(this->super_BaseSelectBinder).super_ExpressionBinder.target_type,&local_30);
  LogicalType::~LogicalType(&local_30);
  return;
}

Assistant:

HavingBinder::HavingBinder(Binder &binder, ClientContext &context, BoundSelectNode &node, BoundGroupInformation &info,
                           AggregateHandling aggregate_handling)
    : BaseSelectBinder(binder, context, node, info), column_alias_binder(node.bind_state),
      aggregate_handling(aggregate_handling) {
	target_type = LogicalType(LogicalTypeId::BOOLEAN);
}